

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264e_dpb.c
# Opt level: O0

MPP_RET h264e_dpb_setup(H264eDpb *dpb,MppEncCfgSet *cfg,H264eSps *sps)

{
  uint uVar1;
  RK_S32 RVar2;
  uint uVar3;
  uint uVar4;
  MppEncCpbInfo *pMVar5;
  RK_S32 log2_max_poc_lsb;
  RK_S32 log2_max_frm_num;
  RK_S32 ref_frm_num;
  MppEncCpbInfo *info;
  MPP_RET ret;
  H264eSps *sps_local;
  MppEncCfgSet *cfg_local;
  H264eDpb *dpb_local;
  
  pMVar5 = mpp_enc_ref_cfg_get_cpb_info(cfg->ref_cfg);
  if ((h264e_debug & 0x100) != 0) {
    _mpp_log_l(4,"h264e_dpb","enter %p\n","h264e_dpb_setup",dpb);
  }
  uVar1 = sps->num_ref_frames;
  uVar3 = sps->log2_max_frame_num_minus4 + 4;
  uVar4 = sps->log2_max_poc_lsb_minus4 + 4;
  h264e_dpb_init(dpb,dpb->reorder,dpb->marking);
  RVar2 = pMVar5->max_lt_cnt;
  (dpb->info).dpb_size = pMVar5->dpb_size;
  (dpb->info).max_lt_cnt = RVar2;
  RVar2 = pMVar5->max_lt_idx;
  (dpb->info).max_st_cnt = pMVar5->max_st_cnt;
  (dpb->info).max_lt_idx = RVar2;
  RVar2 = pMVar5->lt_gop;
  (dpb->info).max_st_tid = pMVar5->max_st_tid;
  (dpb->info).lt_gop = RVar2;
  (dpb->info).st_gop = pMVar5->st_gop;
  dpb->dpb_size = pMVar5->dpb_size;
  dpb->total_cnt = pMVar5->dpb_size + 1;
  dpb->max_frm_num = 1 << ((byte)uVar3 & 0x1f);
  dpb->max_poc_lsb = 1 << ((byte)uVar4 & 0x1f);
  dpb->poc_type = sps->pic_order_cnt_type;
  if ((cfg->hw).extra_buf != 0) {
    dpb->total_cnt = dpb->total_cnt + 1;
  }
  if ((h264e_debug & 0x100) != 0) {
    _mpp_log_l(4,"h264e_dpb","max  ref frm num %d total slot %d\n","h264e_dpb_setup",(ulong)uVar1,
               (ulong)(uint)dpb->total_cnt);
  }
  if ((h264e_debug & 0x100) != 0) {
    _mpp_log_l(4,"h264e_dpb","log2 max frm num %d -> %d\n","h264e_dpb_setup",(ulong)uVar3,
               (ulong)(uint)dpb->max_frm_num);
  }
  if ((h264e_debug & 0x100) != 0) {
    _mpp_log_l(4,"h264e_dpb","log2 max poc lsb %d -> %d\n","h264e_dpb_setup",(ulong)uVar4,
               (ulong)(uint)dpb->max_poc_lsb);
  }
  if ((h264e_debug & 0x100) != 0) {
    _mpp_log_l(4,"h264e_dpb","leave %p\n","h264e_dpb_setup",dpb);
  }
  return MPP_OK;
}

Assistant:

MPP_RET h264e_dpb_setup(H264eDpb *dpb, MppEncCfgSet* cfg, H264eSps *sps)
{
    MPP_RET ret = MPP_OK;
    MppEncCpbInfo *info = mpp_enc_ref_cfg_get_cpb_info(cfg->ref_cfg);

    h264e_dbg_dpb("enter %p\n", dpb);

    RK_S32 ref_frm_num = sps->num_ref_frames;
    RK_S32 log2_max_frm_num = sps->log2_max_frame_num_minus4 + 4;
    RK_S32 log2_max_poc_lsb = sps->log2_max_poc_lsb_minus4 + 4;

    /* NOTE: new configure needs to clear dpb first */
    h264e_dpb_init(dpb, dpb->reorder, dpb->marking);

    memcpy(&dpb->info, info, sizeof(dpb->info));
    dpb->dpb_size = info->dpb_size;
    dpb->total_cnt = info->dpb_size + 1;
    dpb->max_frm_num = 1 << log2_max_frm_num;
    dpb->max_poc_lsb = (1 << log2_max_poc_lsb);
    dpb->poc_type = sps->pic_order_cnt_type;

    if (cfg->hw.extra_buf)
        dpb->total_cnt++;

    h264e_dbg_dpb("max  ref frm num %d total slot %d\n",
                  ref_frm_num, dpb->total_cnt);
    h264e_dbg_dpb("log2 max frm num %d -> %d\n",
                  log2_max_frm_num, dpb->max_frm_num);
    h264e_dbg_dpb("log2 max poc lsb %d -> %d\n",
                  log2_max_poc_lsb, dpb->max_poc_lsb);

    h264e_dbg_dpb("leave %p\n", dpb);

    return ret;
}